

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall CS248::Camera::copyPlacement(Camera *this,Camera *other)

{
  long in_RSI;
  long in_RDI;
  
  *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RSI + 0x28);
  *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RSI + 0x30);
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RSI + 0x38);
  *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RSI + 0x40);
  *(undefined8 *)(in_RDI + 0x48) = *(undefined8 *)(in_RSI + 0x48);
  *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RSI + 0x50);
  *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(in_RSI + 0x58);
  *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(in_RSI + 0x60);
  *(undefined8 *)(in_RDI + 0x70) = *(undefined8 *)(in_RSI + 0x70);
  *(undefined8 *)(in_RDI + 0x78) = *(undefined8 *)(in_RSI + 0x78);
  memcpy((void *)(in_RDI + 0x80),(void *)(in_RSI + 0x80),0x48);
  return;
}

Assistant:

void Camera::copyPlacement(const Camera& other) {
    pos = other.pos;
    targetPos = other.targetPos;
    phi = other.phi;
    theta = other.theta;
    minR = other.minR;
    maxR = other.maxR;
    c2w = other.c2w;
}